

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O3

void __thiscall CServerBrowserFilter::CServerFilter::Filter(CServerFilter *this)

{
  char *needle;
  char cVar1;
  uint uVar2;
  uint uVar3;
  CConfig *pCVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  char *pcVar10;
  long lVar11;
  CServerBrowserFilter *pCVar12;
  CServerEntry *pCVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  
  uVar2 = this->m_pServerBrowserFilter->m_NumServers;
  this->m_NumSortedPlayers = 0;
  this->m_NumSortedServers = 0;
  if (this->m_SortedServersCapacity < (int)uVar2) {
    if (this->m_pSortedServerlist != (int *)0x0) {
      mem_free(this->m_pSortedServerlist);
    }
    iVar7 = (int)uVar2 / 2 + uVar2;
    iVar14 = 1000;
    if (1000 < iVar7) {
      iVar14 = iVar7;
    }
    this->m_SortedServersCapacity = iVar14;
    piVar9 = (int *)mem_alloc(iVar14 << 2);
    this->m_pSortedServerlist = piVar9;
  }
  if (0 < (int)uVar2) {
    needle = (this->m_FilterInfo).m_aAddress;
    uVar15 = 0;
    do {
      uVar3 = (this->m_FilterInfo).m_SortHash;
      pCVar12 = this->m_pServerBrowserFilter;
      pCVar13 = pCVar12->m_ppServerlist[uVar15];
      if ((char)uVar3 < '\0') {
        iVar14 = (pCVar13->m_Info).m_NumPlayers;
        lVar11 = 0x60;
        if ((uVar3 & 0x10) != 0) goto LAB_0012c857;
      }
      else {
        iVar14 = (pCVar13->m_Info).m_NumClients;
        if ((uVar3 & 0x10) != 0) {
          iVar14 = iVar14 - (pCVar13->m_Info).m_NumBotPlayers;
          lVar11 = 100;
LAB_0012c857:
          iVar14 = iVar14 - *(int *)((pCVar13->m_Addr).ip + lVar11 + -4);
        }
      }
      if (((((((uVar3 & 0x20) == 0) || (iVar14 != 0)) &&
            (((uVar3 & 0x40) == 0 ||
             (((-1 < (char)uVar3 ||
               ((pCVar13->m_Info).m_NumPlayers != (pCVar13->m_Info).m_MaxPlayers)) &&
              ((pCVar13->m_Info).m_NumClients != (pCVar13->m_Info).m_MaxClients)))))) &&
           (((uVar3 >> 9 & 1) == 0 || (((pCVar13->m_Info).m_Flags & 1) == 0)))) &&
          (((uVar3 >> 10 & 1) == 0 || ((pCVar13->m_Info).m_Favorite == true)))) &&
         (((((uVar3 >> 0xc & 1) == 0 || (((pCVar13->m_Info).m_Flags & 2) != 0)) &&
           (((uVar3 >> 0xd & 1) == 0 || (((pCVar13->m_Info).m_Flags & 4) != 0)))) &&
          ((pCVar13->m_Info).m_Latency <= (this->m_FilterInfo).m_Ping)))) {
        if ((uVar3 >> 0xb & 1) != 0) {
          iVar7 = str_comp_num((pCVar13->m_Info).m_aVersion,pCVar12->m_aNetVersion,3);
          if (iVar7 != 0) goto LAB_0012c862;
          pCVar12 = this->m_pServerBrowserFilter;
        }
        if (*needle != '\0') {
          pcVar10 = str_find_nocase((pCVar12->m_ppServerlist[uVar15]->m_Info).m_aAddress,needle);
          if (pcVar10 == (char *)0x0) goto LAB_0012c862;
          pCVar12 = this->m_pServerBrowserFilter;
        }
        if (((uint)(this->m_FilterInfo).m_ServerLevel >>
             ((pCVar12->m_ppServerlist[uVar15]->m_Info).m_ServerLevel & 0x1fU) & 1) == 0) {
          if ((this->m_FilterInfo).m_aGametype[0][0] != '\0') {
            lVar11 = 0x18;
            bVar5 = 0;
            pcVar10 = (this->m_FilterInfo).m_aGametypeExclusive;
            do {
              bVar6 = 1;
              if (*(char *)((long)((this->m_FilterInfo).m_aGametype + -2) + 8 + lVar11) == '\0')
              break;
              cVar1 = *pcVar10;
              iVar7 = str_comp_nocase((this->m_pServerBrowserFilter->m_ppServerlist[uVar15]->m_Info)
                                      .m_aGameType,
                                      (char *)((long)((this->m_FilterInfo).m_aGametype + -2) + 8 +
                                              lVar11));
              if (cVar1 == '\0') {
                bVar5 = 1;
                if (iVar7 == 0) {
                  bVar6 = 0;
                  break;
                }
              }
              else if (iVar7 == 0) goto LAB_0012c862;
              pcVar10 = pcVar10 + 1;
              lVar11 = lVar11 + 0x10;
            } while (lVar11 != 0x98);
            if ((bool)(bVar6 & bVar5)) goto LAB_0012c862;
            pCVar12 = this->m_pServerBrowserFilter;
          }
          if (((this->m_FilterInfo).m_SortHash & 0x4000) == 0) {
LAB_0012c9ca:
            pCVar4 = pCVar12->m_pConfig;
            if (pCVar4->m_BrFilterString[0] != '\0') {
              pCVar13 = pCVar12->m_ppServerlist[uVar15];
              (pCVar13->m_Info).m_QuickSearchHit = 0;
              pcVar10 = str_find_nocase((pCVar13->m_Info).m_aName,pCVar4->m_BrFilterString);
              pCVar12 = this->m_pServerBrowserFilter;
              pCVar13 = pCVar12->m_ppServerlist[uVar15];
              bVar17 = pcVar10 != (char *)0x0;
              if (bVar17) {
                piVar9 = &(pCVar13->m_Info).m_QuickSearchHit;
                *(byte *)piVar9 = (byte)*piVar9 | 1;
              }
              if (0 < (pCVar13->m_Info).m_NumClients) {
                lVar16 = 0x1b8;
                lVar11 = 0;
                do {
                  pcVar10 = str_find_nocase((char *)((pCVar13->m_Addr).ip + lVar16 + -4),
                                            pCVar12->m_pConfig->m_BrFilterString);
                  if ((pcVar10 != (char *)0x0) ||
                     (pcVar10 = str_find_nocase((char *)((this->m_pServerBrowserFilter->
                                                          m_ppServerlist[uVar15]->m_Info).m_NetAddr.
                                                         ip + lVar16 + 0xd),
                                                this->m_pServerBrowserFilter->m_pConfig->
                                                m_BrFilterString), pcVar10 != (char *)0x0)) {
                    pCVar12 = this->m_pServerBrowserFilter;
                    pCVar13 = pCVar12->m_ppServerlist[uVar15];
                    piVar9 = &(pCVar13->m_Info).m_QuickSearchHit;
                    *piVar9 = *piVar9 | 2;
                    bVar17 = true;
                    break;
                  }
                  lVar11 = lVar11 + 1;
                  pCVar12 = this->m_pServerBrowserFilter;
                  pCVar13 = pCVar12->m_ppServerlist[uVar15];
                  lVar16 = lVar16 + 0x84;
                } while (lVar11 < (pCVar13->m_Info).m_NumClients);
              }
              pcVar10 = str_find_nocase((pCVar13->m_Info).m_aMap,
                                        pCVar12->m_pConfig->m_BrFilterString);
              pCVar12 = this->m_pServerBrowserFilter;
              pCVar13 = pCVar12->m_ppServerlist[uVar15];
              if (pcVar10 == (char *)0x0) {
                pcVar10 = str_find_nocase((pCVar13->m_Info).m_aGameType,
                                          pCVar12->m_pConfig->m_BrFilterString);
                if (pcVar10 != (char *)0x0) goto LAB_0012cb72;
                if (!bVar17) goto LAB_0012c862;
              }
              else {
                piVar9 = &(pCVar13->m_Info).m_QuickSearchHit;
                *(byte *)piVar9 = (byte)*piVar9 | 4;
                pcVar10 = str_find_nocase((pCVar13->m_Info).m_aGameType,
                                          pCVar12->m_pConfig->m_BrFilterString);
                if (pcVar10 != (char *)0x0) {
LAB_0012cb72:
                  pCVar12 = this->m_pServerBrowserFilter;
                  piVar9 = &(pCVar12->m_ppServerlist[uVar15]->m_Info).m_QuickSearchHit;
                  *piVar9 = *piVar9 | 8;
                  goto LAB_0012cb92;
                }
              }
              pCVar12 = this->m_pServerBrowserFilter;
            }
LAB_0012cb92:
            pCVar13 = pCVar12->m_ppServerlist[uVar15];
            (pCVar13->m_Info).m_FriendState = 0;
            if ((pCVar13->m_Info).m_NumClients < 1) {
              if (((this->m_FilterInfo).m_SortHash & 0x100) == 0) goto LAB_0012cc1e;
            }
            else {
              lVar11 = 0x1b8;
              lVar16 = 0;
              do {
                iVar8 = (*(pCVar12->m_pFriends->super_IInterface)._vptr_IInterface[5])
                                  (pCVar12->m_pFriends,(pCVar13->m_Addr).ip + lVar11 + -4,
                                   (pCVar13->m_Info).m_NetAddr.ip + lVar11 + 0xd);
                pCVar12 = this->m_pServerBrowserFilter;
                pCVar13 = pCVar12->m_ppServerlist[uVar15];
                *(int *)((pCVar13->m_Info).m_aGameType + lVar11 + 8) = iVar8;
                iVar7 = (pCVar13->m_Info).m_FriendState;
                if (iVar8 < iVar7) {
                  iVar8 = iVar7;
                }
                (pCVar13->m_Info).m_FriendState = iVar8;
                lVar16 = lVar16 + 1;
                lVar11 = lVar11 + 0x84;
              } while (lVar16 < (pCVar13->m_Info).m_NumClients);
              if ((((this->m_FilterInfo).m_SortHash & 0x100) == 0) || (iVar8 != 0)) {
LAB_0012cc1e:
                iVar7 = this->m_NumSortedServers;
                this->m_NumSortedServers = iVar7 + 1;
                this->m_pSortedServerlist[iVar7] = (int)uVar15;
                this->m_NumSortedPlayers = this->m_NumSortedPlayers + iVar14;
              }
            }
          }
          else {
            lVar11 = (long)(pCVar12->m_ppServerlist[uVar15]->m_Info).m_NumClients;
            if (0 < lVar11) {
              lVar16 = 0;
              do {
                if (*(int *)((pCVar12->m_ppServerlist[uVar15]->m_Info).m_aClients[0].m_aClan +
                            lVar16 + 0x33) == (this->m_FilterInfo).m_Country) goto LAB_0012c9ca;
                lVar16 = lVar16 + 0x84;
              } while (lVar11 * 0x84 != lVar16);
            }
          }
        }
      }
LAB_0012c862:
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar2);
  }
  return;
}

Assistant:

void CServerBrowserFilter::CServerFilter::Filter()
{
	int NumServers = m_pServerBrowserFilter->m_NumServers;
	m_NumSortedServers = 0;
	m_NumSortedPlayers = 0;

	// allocate the sorted list
	if(m_SortedServersCapacity < NumServers)
	{
		if(m_pSortedServerlist)
			mem_free(m_pSortedServerlist);
		m_SortedServersCapacity = maximum(1000, NumServers+NumServers/2);
		m_pSortedServerlist = (int *)mem_alloc(m_SortedServersCapacity*sizeof(int));
	}

	// filter the servers
	for(int i = 0; i < NumServers; i++)
	{
		int Filtered = 0;

		int RelevantClientCount = (m_FilterInfo.m_SortHash&IServerBrowser::FILTER_SPECTATORS) ? m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumPlayers : m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients;
		if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_BOTS)
		{
			RelevantClientCount -= m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumBotPlayers;
			if(!(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_SPECTATORS))
				RelevantClientCount -= m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumBotSpectators;
		}

		if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_EMPTY && RelevantClientCount == 0)
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FULL && ((m_FilterInfo.m_SortHash&IServerBrowser::FILTER_SPECTATORS && m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumPlayers == m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_MaxPlayers) ||
				m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients == m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_MaxClients))
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_PW && m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Flags&IServerBrowser::FLAG_PASSWORD)
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FAVORITE && !m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Favorite)
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_PURE && !(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Flags&IServerBrowser::FLAG_PURE))
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_PURE_MAP &&  !(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Flags&IServerBrowser::FLAG_PUREMAP))
			Filtered = 1;
		else if(m_FilterInfo.m_Ping < m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Latency)
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_COMPAT_VERSION && str_comp_num(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aVersion, m_pServerBrowserFilter->m_aNetVersion, 3) != 0)
			Filtered = 1;
		else if(m_FilterInfo.m_aAddress[0] && !str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aAddress, m_FilterInfo.m_aAddress))
			Filtered = 1;
		else if(m_FilterInfo.IsLevelFiltered(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_ServerLevel))
			Filtered = 1;
		else
		{
			if(m_FilterInfo.m_aGametype[0][0])
			{
				bool Excluded = false, DoInclude = false, Included = false;
				for(int Index = 0; Index < CServerFilterInfo::MAX_GAMETYPES; ++Index)
				{
					if(!m_FilterInfo.m_aGametype[Index][0])
						break;
					if(m_FilterInfo.m_aGametypeExclusive[Index])
					{
						if(!str_comp_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aGameType, m_FilterInfo.m_aGametype[Index]))
						{
							Excluded = true;
							break;
						}
					}
					else
					{
						DoInclude = true;
						if(!str_comp_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aGameType, m_FilterInfo.m_aGametype[Index]))
						{
							Included = true;
							break;
						}
					}
				}
				Filtered = Excluded || (DoInclude && !Included);
			}

			if(!Filtered && m_FilterInfo.m_SortHash&IServerBrowser::FILTER_COUNTRY)
			{
				Filtered = 1;
				// match against player country
				for(int p = 0; p < m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients; p++)
				{
					if(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_Country == m_FilterInfo.m_Country)
					{
						Filtered = 0;
						break;
					}
				}
			}

			if(!Filtered && Config()->m_BrFilterString[0] != 0)
			{
				int MatchFound = 0;

				m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit = 0;

				// match against server name
				if(str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aName, Config()->m_BrFilterString))
				{
					MatchFound = 1;
					m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit |= IServerBrowser::QUICK_SERVERNAME;
				}

				// match against players
				for(int p = 0; p < m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients; p++)
				{
					if(str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_aName, Config()->m_BrFilterString) ||
						str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_aClan, Config()->m_BrFilterString))
					{
						MatchFound = 1;
						m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit |= IServerBrowser::QUICK_PLAYER;
						break;
					}
				}

				// match against map
				if(str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aMap, Config()->m_BrFilterString))
				{
					MatchFound = 1;
					m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit |= IServerBrowser::QUICK_MAPNAME;
				}

				// match against game type
				if(str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aGameType, Config()->m_BrFilterString))
				{
					MatchFound = 1;
					m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit |= IServerBrowser::QUICK_GAMETYPE;
				}

				if(!MatchFound)
					Filtered = 1;
			}
		}

		if(Filtered == 0)
		{
			// check for friend
			m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_FriendState = CContactInfo::CONTACT_NO;
			for(int p = 0; p < m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients; p++)
			{
				m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_FriendState = m_pServerBrowserFilter->m_pFriends->GetFriendState(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_aName,
					m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_aClan);
				m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_FriendState = maximum(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_FriendState, m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_FriendState);
			}

			if(!(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FRIENDS) || m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_FriendState != CContactInfo::CONTACT_NO)
			{
				m_pSortedServerlist[m_NumSortedServers++] = i;
				m_NumSortedPlayers += RelevantClientCount;
			}
		}
	}
}